

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu.h
# Opt level: O3

value_type *
basisu::enlarge_vector<basisu::vector<basisu::vector<unsigned_int>>>
          (vector<basisu::vector<unsigned_int>_> *vec,size_t n)

{
  uint uVar1;
  vector<unsigned_int> *pvVar2;
  void *__ptr;
  long lVar3;
  uint uVar4;
  uint min_new_capacity;
  ulong uVar5;
  
  uVar1 = vec->m_size;
  uVar5 = n + uVar1;
  if (uVar5 >> 0x20 != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                  ,0x217,
                  "void basisu::vector<basisu::vector<unsigned int>>::resize(size_t, bool) [T = basisu::vector<unsigned int>]"
                 );
  }
  min_new_capacity = (uint)uVar5;
  uVar4 = uVar1 - min_new_capacity;
  if (uVar4 != 0) {
    if (uVar1 < min_new_capacity || uVar4 == 0) {
      uVar4 = uVar1;
      if (vec->m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)vec,min_new_capacity,uVar1 + 1 == min_new_capacity,0x10,
                   (object_mover)0x0,false);
        uVar4 = vec->m_size;
      }
      if (min_new_capacity - uVar4 != 0) {
        memset(vec->m_p + uVar4,0,(ulong)(min_new_capacity - uVar4) << 4);
      }
    }
    else {
      pvVar2 = vec->m_p;
      lVar3 = 0;
      do {
        __ptr = *(void **)((long)&pvVar2[uVar5].m_p + lVar3);
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        lVar3 = lVar3 + 0x10;
      } while ((ulong)uVar4 << 4 != lVar3);
    }
    vec->m_size = min_new_capacity;
    if (uVar1 < min_new_capacity) {
      return vec->m_p + uVar1;
    }
  }
  __assert_fail("i < m_size",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                ,0x178,
                "T &basisu::vector<basisu::vector<unsigned int>>::operator[](size_t) [T = basisu::vector<unsigned int>]"
               );
}

Assistant:

inline bool is_pow2(uint64_t x) { return x && ((x & (x - 1U)) == 0U); }